

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_transfer_bindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  sqlite3_stmt *in_RSI;
  sqlite3_stmt *in_RDI;
  Vdbe *pTo;
  Vdbe *pFrom;
  int local_4;
  
  if (*(short *)(in_RDI + 0x20) == *(short *)(in_RSI + 0x20)) {
    if (*(int *)(in_RSI + 0x10c) != 0) {
      *(ushort *)(in_RSI + 0xc1) = *(ushort *)(in_RSI + 0xc1) & 0xfffc | 1;
    }
    if (*(int *)(in_RDI + 0x10c) != 0) {
      *(ushort *)(in_RDI + 0xc1) = *(ushort *)(in_RDI + 0xc1) & 0xfffc | 1;
    }
    local_4 = sqlite3TransferBindings(in_RDI,in_RSI);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_transfer_bindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  if( pFrom->nVar!=pTo->nVar ){
    return SQLITE_ERROR;
  }
  assert( (pTo->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || pTo->expmask==0 );
  if( pTo->expmask ){
    pTo->expired = 1;
  }
  assert( (pFrom->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || pFrom->expmask==0 );
  if( pFrom->expmask ){
    pFrom->expired = 1;
  }
  return sqlite3TransferBindings(pFromStmt, pToStmt);
}